

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFStream.cxx
# Opt level: O3

int testFStream(int param_1,char **param_2)

{
  uint uVar1;
  undefined8 uVar2;
  BOM BVar3;
  int iVar4;
  long *plVar5;
  int iVar6;
  ulong uVar7;
  uchar *puVar8;
  long lVar9;
  BOM *pBVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  ifstream in_file;
  undefined1 local_278 [56];
  long local_240;
  filebuf local_238 [8];
  char local_230 [16];
  uint auStack_220 [54];
  ios_base local_148 [280];
  
  std::ifstream::ifstream((istream *)&local_240,"NoSuchFile.txt",_S_in);
  uVar1 = *(uint *)((long)auStack_220 + *(long *)(local_240 + -0x18));
  std::ifstream::~ifstream((istream *)&local_240);
  uVar2 = _strtod;
  lVar11 = _VTT;
  bVar12 = true;
  pBVar10 = expected_bom;
  puVar8 = file_data[0] + 1;
  lVar9 = 0x13f731;
  uVar7 = 0;
  do {
    std::ofstream::ofstream((istream *)&local_240,"bom.txt",_S_bin);
    std::ostream::write((char *)&local_240,lVar9);
    std::ostream::write((char *)&local_240,(long)puVar8);
    local_240 = lVar11;
    *(undefined8 *)(local_238 + *(long *)(lVar11 + -0x18) + -8) = uVar2;
    std::filebuf::~filebuf(local_238);
    std::ios_base::~ios_base(local_148);
    std::ifstream::ifstream((istream *)&local_240,"bom.txt",_S_bin);
    BVar3 = cmsys::FStream::ReadBOM((istream *)&local_240);
    iVar6 = (int)uVar7;
    if (BVar3 != *pBVar10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unexpected BOM ",0xf);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
LAB_00114974:
      std::ifstream::~ifstream(&local_240);
      goto LAB_0011497e;
    }
    std::istream::read((char *)&local_240,(long)local_278);
    if (*(int *)((long)auStack_220 + *(long *)(local_240 + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unable to read data ",0x14);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
LAB_00114961:
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      goto LAB_00114974;
    }
    iVar4 = bcmp(local_278,puVar8,(ulong)(*(uchar (*) [45])(puVar8 + -1))[0]);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Incorrect read data ",0x14);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00114961;
    }
    std::ifstream::~ifstream((istream *)&local_240);
    bVar12 = uVar7 < 6;
    uVar7 = uVar7 + 1;
    pBVar10 = pBVar10 + 1;
    puVar8 = puVar8 + 0x2d;
    lVar9 = lVar9 + 5;
  } while (uVar7 != 7);
  bVar12 = false;
LAB_0011497e:
  bVar13 = true;
  pBVar10 = expected_bom;
  puVar8 = file_data[0] + 1;
  lVar11 = 0x13f731;
  uVar7 = 0;
  do {
    std::fstream::fstream((istream *)&local_240,"bomio.txt",_S_trunc|_S_out|_S_in|_S_bin);
    std::ostream::write(local_230,lVar11);
    std::ostream::write(local_230,(long)puVar8);
    iVar6 = (int)uVar7;
    if (*(int *)((long)auStack_220 + *(long *)(local_240 + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unable to write data ",0x15);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
LAB_00114bb7:
      std::fstream::~fstream(&local_240);
      goto LAB_00114bc5;
    }
    std::ostream::seekp(local_230,0,0);
    BVar3 = cmsys::FStream::ReadBOM((istream *)&local_240);
    if (BVar3 != *pBVar10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unexpected BOM ",0xf);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      goto LAB_00114bb7;
    }
    std::istream::read((char *)&local_240,(long)local_278);
    if (*(int *)((long)auStack_220 + *(long *)(local_240 + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unable to read data ",0x14);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
LAB_00114ba4:
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      goto LAB_00114bb7;
    }
    iVar4 = bcmp(local_278,puVar8,(ulong)(*(uchar (*) [45])(puVar8 + -1))[0]);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Incorrect read data ",0x14);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00114ba4;
    }
    std::fstream::~fstream((istream *)&local_240);
    bVar13 = uVar7 < 6;
    uVar7 = uVar7 + 1;
    pBVar10 = pBVar10 + 1;
    puVar8 = puVar8 + 0x2d;
    lVar11 = lVar11 + 5;
  } while (uVar7 != 7);
  bVar13 = false;
LAB_00114bc5:
  return (uint)(byte)(bVar12 | bVar13 | (uVar1 & 5) == 0);
}

Assistant:

static int testNoFile()
{
  kwsys::ifstream in_file("NoSuchFile.txt");
  if (in_file) {
    return 1;
  }

  return 0;
}